

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

pair<unsigned_long,_bool> __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
::find_or_prepare_insert<unsigned_long>
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_long>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<unsigned_long>_>
           *this,unsigned_long *key,size_t hashval)

{
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  ushort uVar4;
  byte bVar5;
  ulong uVar6;
  undefined8 extraout_RDX;
  undefined8 uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  __m128i match;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  pair<unsigned_long,_bool> pVar22;
  char cVar17;
  char cVar19;
  char cVar20;
  char cVar21;
  
  uVar2 = this->capacity_;
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SchrodingerZhu[P]backend/parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x55,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
  }
  uVar9 = hashval >> 7 & uVar2;
  bVar5 = (byte)hashval;
  uVar6 = (ulong)(bVar5 & 0x7f);
  auVar15 = ZEXT216(CONCAT11(bVar5,bVar5) & 0x7f7f);
  auVar15 = pshuflw(auVar15,auVar15,0);
  lVar11 = 0;
  do {
    pcVar1 = this->ctrl_ + uVar9;
    cVar17 = auVar15[0];
    auVar18[0] = -(cVar17 == *pcVar1);
    cVar19 = auVar15[1];
    auVar18[1] = -(cVar19 == pcVar1[1]);
    cVar20 = auVar15[2];
    auVar18[2] = -(cVar20 == pcVar1[2]);
    cVar21 = auVar15[3];
    auVar18[3] = -(cVar21 == pcVar1[3]);
    auVar18[4] = -(cVar17 == pcVar1[4]);
    auVar18[5] = -(cVar19 == pcVar1[5]);
    auVar18[6] = -(cVar20 == pcVar1[6]);
    auVar18[7] = -(cVar21 == pcVar1[7]);
    auVar18[8] = -(cVar17 == pcVar1[8]);
    auVar18[9] = -(cVar19 == pcVar1[9]);
    auVar18[10] = -(cVar20 == pcVar1[10]);
    auVar18[0xb] = -(cVar21 == pcVar1[0xb]);
    auVar18[0xc] = -(cVar17 == pcVar1[0xc]);
    auVar18[0xd] = -(cVar19 == pcVar1[0xd]);
    auVar18[0xe] = -(cVar20 == pcVar1[0xe]);
    auVar18[0xf] = -(cVar21 == pcVar1[0xf]);
    uVar4 = (ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe | (ushort)(auVar18[0xf] >> 7) << 0xf;
    iVar8 = 4;
    bVar14 = uVar4 == 0;
    if (!bVar14) {
      uVar12 = (uint)uVar4;
      do {
        uVar3 = 0;
        if (uVar12 != 0) {
          for (; (uVar12 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        uVar13 = uVar3 + uVar9 & uVar2;
        if (this->slots_[uVar13] == *key) {
          iVar8 = 1;
          uVar6 = uVar13;
          break;
        }
        uVar12 = uVar12 - 1 & uVar12;
        bVar14 = uVar12 == 0;
      } while (!bVar14);
    }
    if (bVar14) {
      auVar16[0] = -(*pcVar1 == -0x80);
      auVar16[1] = -(pcVar1[1] == -0x80);
      auVar16[2] = -(pcVar1[2] == -0x80);
      auVar16[3] = -(pcVar1[3] == -0x80);
      auVar16[4] = -(pcVar1[4] == -0x80);
      auVar16[5] = -(pcVar1[5] == -0x80);
      auVar16[6] = -(pcVar1[6] == -0x80);
      auVar16[7] = -(pcVar1[7] == -0x80);
      auVar16[8] = -(pcVar1[8] == -0x80);
      auVar16[9] = -(pcVar1[9] == -0x80);
      auVar16[10] = -(pcVar1[10] == -0x80);
      auVar16[0xb] = -(pcVar1[0xb] == -0x80);
      auVar16[0xc] = -(pcVar1[0xc] == -0x80);
      auVar16[0xd] = -(pcVar1[0xd] == -0x80);
      auVar16[0xe] = -(pcVar1[0xe] == -0x80);
      auVar16[0xf] = -(pcVar1[0xf] == -0x80);
      iVar8 = 3;
      if ((((((((((((((((auVar16 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (auVar16 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar16 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar16 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar16 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                   (auVar16 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar16 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar16 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar16 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar16 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar16 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar16 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar16 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar16 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar16 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar16[0xf])
      {
        lVar10 = uVar9 + lVar11;
        lVar11 = lVar11 + 0x10;
        uVar9 = lVar10 + 0x10U & uVar2;
        iVar8 = 0;
      }
    }
    if (iVar8 != 0) {
      if (iVar8 == 3) {
        uVar6 = prepare_insert(this,hashval);
        uVar7 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      }
      else {
        uVar7 = 0;
      }
      pVar22._8_8_ = uVar7;
      pVar22.first = uVar6;
      return pVar22;
    }
  } while( true );
}

Assistant:

probe_seq<Group::kWidth> probe(size_t hashval) const {
        return probe_seq<Group::kWidth>(H1(hashval, ctrl_), capacity_);
    }